

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  stbi_uc *psVar15;
  stbi_uc *psVar16;
  stbi_uc *psVar17;
  stbi_uc *psVar18;
  stbi_uc sVar19;
  int iVar20;
  uint uVar21;
  undefined4 in_register_0000000c;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  size_t __size;
  size_t __size_00;
  char *local_70;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar8 = stbi__gif_header(s,g,comp,0);
    if (iVar8 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar8 = g->h * g->w;
    __size = (size_t)(iVar8 * 4);
    psVar15 = (stbi_uc *)calloc(1,__size);
    g->out = psVar15;
    psVar16 = (stbi_uc *)malloc(__size);
    __size_00 = (size_t)iVar8;
    g->background = psVar16;
    psVar17 = (stbi_uc *)malloc(__size_00);
    g->history = psVar17;
    if (psVar15 == (stbi_uc *)0x0) {
      stbi__g_failure_reason = "outofmem";
      return (stbi_uc *)0x0;
    }
    memset(psVar16,0,__size);
    memset(psVar17,0,__size_00);
  }
  else {
    uVar24 = (uint)g->eflags >> 2 & 7;
    uVar7 = g->h * g->w;
    uVar9 = 2;
    if (uVar24 != 3) {
      uVar9 = uVar24;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar9 = uVar24;
    }
    if (uVar9 == 3) {
      if (0 < (int)uVar7) {
        uVar22 = 0;
        do {
          if (g->history[uVar22] != '\0') {
            *(undefined4 *)(g->out + uVar22 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar22 * 4);
          }
          uVar22 = uVar22 + 1;
        } while (uVar7 != uVar22);
      }
    }
    else if ((uVar9 == 2) && (0 < (int)uVar7)) {
      uVar22 = 0;
      do {
        if (g->history[uVar22] != '\0') {
          *(undefined4 *)(g->out + uVar22 * 4) = *(undefined4 *)(g->background + uVar22 * 4);
        }
        uVar22 = uVar22 + 1;
      } while (uVar7 != uVar22);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
    psVar17 = g->history;
    __size_00 = (long)g->h * (long)g->w;
  }
  memset(psVar17,0,__size_00);
  psVar17 = s->buffer_start;
  psVar15 = s->buffer_start + 1;
  local_70 = "unknown code";
LAB_0011135d:
  pbVar2 = s->img_buffer;
  psVar16 = s->img_buffer_end;
  if (pbVar2 < psVar16) {
    s->img_buffer = pbVar2 + 1;
    bVar6 = *pbVar2;
    psVar18 = pbVar2 + 1;
  }
  else {
    if (s->read_from_callbacks == 0) {
      stbi__g_failure_reason = local_70;
      return (stbi_uc *)0x0;
    }
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar6 = 0;
      psVar16 = psVar15;
    }
    else {
      bVar6 = *psVar17;
      psVar16 = psVar17 + iVar8;
    }
    s->img_buffer_end = psVar16;
    s->img_buffer = psVar15;
    psVar18 = psVar15;
  }
  if (bVar6 == 0x21) {
    if (psVar18 < psVar16) {
      s->img_buffer = psVar18 + 1;
      bVar6 = *psVar18;
      psVar18 = psVar18 + 1;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_001115f4;
      iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
      if (iVar8 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar6 = 0;
        psVar16 = psVar15;
      }
      else {
        bVar6 = *psVar17;
        psVar16 = psVar17 + iVar8;
      }
      s->img_buffer_end = psVar16;
      s->img_buffer = psVar15;
      psVar18 = psVar15;
    }
    if (bVar6 != 0xf9) goto LAB_001115f4;
    if (psVar18 < psVar16) {
      s->img_buffer = psVar18 + 1;
      bVar6 = *psVar18;
      psVar18 = psVar18 + 1;
LAB_0011148b:
      if (bVar6 == 4) {
        if (psVar18 < psVar16) {
          s->img_buffer = psVar18 + 1;
          uVar9 = (uint)*psVar18;
        }
        else if (s->read_from_callbacks == 0) {
          uVar9 = 0;
        }
        else {
          iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
          if (iVar8 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            uVar9 = 0;
            psVar16 = psVar15;
          }
          else {
            uVar9 = (uint)*psVar17;
            psVar16 = psVar17 + iVar8;
          }
          s->img_buffer_end = psVar16;
          s->img_buffer = psVar15;
        }
        g->eflags = uVar9;
        iVar8 = stbi__get16le(s);
        g->delay = iVar8 * 10;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) != 0) {
          pbVar2 = s->img_buffer;
          if (pbVar2 < s->img_buffer_end) {
            s->img_buffer = pbVar2 + 1;
            uVar9 = (uint)*pbVar2;
          }
          else if (s->read_from_callbacks == 0) {
            uVar9 = 0;
          }
          else {
            iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
            if (iVar8 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              uVar9 = 0;
              psVar16 = psVar15;
            }
            else {
              uVar9 = (uint)*psVar17;
              psVar16 = psVar17 + iVar8;
            }
            s->img_buffer_end = psVar16;
            s->img_buffer = psVar15;
          }
          g->transparent = uVar9;
          g->pal[uVar9][3] = '\0';
          goto LAB_001115f4;
        }
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
          psVar16 = s->img_buffer;
LAB_001115a4:
          s->img_buffer = psVar16 + 1;
        }
        else {
          psVar16 = s->img_buffer;
          iVar8 = (int)s->img_buffer_end - (int)psVar16;
          if (0 < iVar8) goto LAB_001115a4;
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,1 - iVar8);
        }
        g->transparent = -1;
LAB_001115f4:
        do {
          pbVar2 = s->img_buffer;
          if (pbVar2 < s->img_buffer_end) {
            s->img_buffer = pbVar2 + 1;
            bVar6 = *pbVar2;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_0011135d;
            iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
            if (iVar8 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar6 = 0;
              psVar16 = psVar15;
            }
            else {
              bVar6 = *psVar17;
              psVar16 = psVar17 + iVar8;
            }
            s->img_buffer_end = psVar16;
            s->img_buffer = psVar15;
          }
          if (bVar6 == 0) goto LAB_0011135d;
          stbi__skip(s,(uint)bVar6);
        } while( true );
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
        if (iVar8 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar6 = 0;
          psVar16 = psVar15;
        }
        else {
          bVar6 = *psVar17;
          psVar16 = psVar17 + iVar8;
        }
        s->img_buffer_end = psVar16;
        s->img_buffer = psVar15;
        psVar18 = psVar15;
        goto LAB_0011148b;
      }
      bVar6 = 0;
    }
    stbi__skip(s,(uint)bVar6);
    goto LAB_0011135d;
  }
  if (bVar6 == 0x3b) {
    return (stbi_uc *)s;
  }
  if (bVar6 != 0x2c) {
    stbi__g_failure_reason = local_70;
    return (stbi_uc *)0x0;
  }
  iVar8 = stbi__get16le(s);
  iVar10 = stbi__get16le(s);
  iVar11 = stbi__get16le(s);
  iVar12 = stbi__get16le(s);
  local_70 = "bad Image Descriptor";
  if (g->w < iVar11 + iVar8) {
    stbi__g_failure_reason = local_70;
    return (stbi_uc *)0x0;
  }
  if (g->h < iVar12 + iVar10) {
    stbi__g_failure_reason = local_70;
    return (stbi_uc *)0x0;
  }
  iVar20 = g->w * 4;
  g->line_size = iVar20;
  g->start_x = iVar8 << 2;
  g->start_y = iVar10 * iVar20;
  g->max_x = (iVar11 + iVar8) * 4;
  g->max_y = (iVar12 + iVar10) * iVar20;
  g->cur_x = iVar8 << 2;
  g->cur_y = iVar10 * iVar20;
  psVar16 = s->img_buffer;
  psVar18 = s->img_buffer_end;
  if (psVar16 < psVar18) {
    s->img_buffer = psVar16 + 1;
    bVar6 = *psVar16;
    psVar16 = psVar16 + 1;
LAB_001117c9:
    g->lflags = (uint)bVar6;
    iVar8 = iVar20 * 8;
    if ((bVar6 & 0x40) == 0) {
      iVar8 = iVar20;
    }
    iVar20 = iVar8;
    uVar9 = (int)((uint)bVar6 << 0x19) >> 0x1f & 3;
  }
  else {
    if (s->read_from_callbacks != 0) {
      iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
      if (iVar8 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar6 = 0;
        psVar18 = psVar15;
      }
      else {
        bVar6 = *psVar17;
        psVar18 = psVar17 + iVar8;
      }
      s->img_buffer_end = psVar18;
      s->img_buffer = psVar15;
      iVar20 = g->line_size;
      psVar16 = psVar15;
      goto LAB_001117c9;
    }
    g->lflags = 0;
    uVar9 = 0;
    bVar6 = 0;
  }
  g->step = iVar20;
  g->parse = uVar9;
  if (bVar6 < 0x80) {
    if ((g->flags & 0x80) == 0) {
      stbi__g_failure_reason = "missing color table";
      return (stbi_uc *)0x0;
    }
    g->color_table = g->pal[0];
  }
  else {
    iVar8 = -1;
    if ((g->eflags & 1) != 0) {
      iVar8 = g->transparent;
    }
    stbi__gif_parse_colortable(s,g->lpal,2 << (bVar6 & 7),iVar8);
    g->color_table = g->lpal[0];
    psVar16 = s->img_buffer;
    psVar18 = s->img_buffer_end;
  }
  if (psVar16 < psVar18) {
    s->img_buffer = psVar16 + 1;
    uVar9 = (uint)*psVar16;
  }
  else {
    if (s->read_from_callbacks == 0) {
      uVar9 = 0;
      goto LAB_001118c9;
    }
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      uVar9 = 0;
      psVar16 = psVar15;
    }
    else {
      uVar9 = (uint)*psVar17;
      psVar16 = psVar17 + iVar8;
    }
    s->img_buffer_end = psVar16;
    s->img_buffer = psVar15;
  }
  if (0xc < (byte)uVar9) {
    return (stbi_uc *)0x0;
  }
LAB_001118c9:
  uVar7 = 1 << (uVar9 & 0x1f);
  uVar22 = 0;
  do {
    g->codes[uVar22].prefix = -1;
    g->codes[uVar22].first = (stbi_uc)uVar22;
    g->codes[uVar22].suffix = (stbi_uc)uVar22;
    uVar22 = uVar22 + 1;
  } while (uVar7 != uVar22);
  uVar24 = 0;
  uVar13 = (2 << (uVar9 & 0x1f)) - 1;
  uVar26 = 0;
  uVar29 = 0;
  bVar6 = 0;
  uVar30 = 0xffffffff;
  uVar3 = uVar7 + 2;
  uVar4 = uVar9 + 1;
  uVar5 = uVar13;
  do {
    while (uVar14 = uVar5, uVar21 = uVar4, uVar23 = uVar3, uVar25 = uVar30, bVar28 = bVar6,
          uVar30 = uVar29 - uVar21, (int)uVar21 <= (int)uVar29) {
      uVar29 = (int)uVar26 >> (uVar21 & 0x1f);
      uVar27 = uVar26 & uVar14;
      uVar26 = uVar29;
      uVar29 = uVar30;
      bVar6 = 1;
      uVar30 = 0xffffffff;
      uVar3 = uVar7 + 2;
      uVar4 = uVar9 + 1;
      uVar5 = uVar13;
      if (uVar27 != uVar7) {
        if (uVar27 == uVar7 + 1) goto LAB_00111b9a;
        if ((int)uVar23 < (int)uVar27) {
          stbi__g_failure_reason = "illegal code in raster";
          return (stbi_uc *)0x0;
        }
        if ((bool)(bVar28 ^ 1)) {
          stbi__g_failure_reason = "no clear code";
          return (stbi_uc *)0x0;
        }
        if ((int)uVar25 < 0) {
          if (uVar27 == uVar23) {
            stbi__g_failure_reason = "illegal code in raster";
            return (stbi_uc *)0x0;
          }
        }
        else {
          if (0x1fff < (int)uVar23) {
            stbi__g_failure_reason = "too many codes";
            return (stbi_uc *)0x0;
          }
          g->codes[(int)uVar23].prefix = (stbi__int16)uVar25;
          sVar19 = g->codes[uVar25].first;
          g->codes[(int)uVar23].first = sVar19;
          if (uVar27 != uVar23 + 1) {
            sVar19 = g->codes[(int)uVar27].first;
          }
          g->codes[(int)uVar23].suffix = sVar19;
          uVar23 = uVar23 + 1;
        }
        stbi__out_gif_code(g,(stbi__uint16)uVar27);
        bVar6 = 1;
        uVar30 = uVar27;
        uVar3 = uVar23;
        uVar4 = uVar21 + 1;
        uVar5 = ~(-1 << (uVar21 + 1 & 0x1f));
        if (0xfff < (int)uVar23 || (uVar23 & uVar14) != 0) {
          uVar4 = uVar21;
          uVar5 = uVar14;
        }
      }
    }
    psVar16 = s->img_buffer;
    psVar18 = s->img_buffer_end;
    if (uVar24 == 0) {
      if (psVar16 < psVar18) {
        s->img_buffer = psVar16 + 1;
        bVar6 = *psVar16;
        psVar16 = psVar16 + 1;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_00111c0a;
        iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
        if (iVar8 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar6 = 0;
          psVar18 = psVar15;
        }
        else {
          bVar6 = *psVar17;
          psVar18 = psVar17 + iVar8;
        }
        s->img_buffer_end = psVar18;
        s->img_buffer = psVar15;
        psVar16 = psVar15;
      }
      if (bVar6 == 0) goto LAB_00111c0a;
      uVar24 = (uint)bVar6;
    }
    if (psVar16 < psVar18) {
      s->img_buffer = psVar16 + 1;
      uVar30 = (uint)*psVar16;
    }
    else if (s->read_from_callbacks == 0) {
      uVar30 = 0;
    }
    else {
      iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
      if (iVar8 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        uVar30 = 0;
        psVar16 = psVar15;
      }
      else {
        uVar30 = (uint)*psVar17;
        psVar16 = psVar17 + iVar8;
      }
      s->img_buffer_end = psVar16;
      s->img_buffer = psVar15;
    }
    uVar24 = uVar24 - 1;
    uVar26 = uVar26 | uVar30 << (uVar29 & 0x1f);
    uVar29 = uVar29 + 8;
    bVar6 = bVar28;
    uVar30 = uVar25;
    uVar3 = uVar23;
    uVar4 = uVar21;
    uVar5 = uVar14;
  } while( true );
LAB_00111b9a:
  stbi__skip(s,uVar24);
  pbVar2 = s->img_buffer;
  if (pbVar2 < s->img_buffer_end) {
    s->img_buffer = pbVar2 + 1;
    bVar6 = *pbVar2;
  }
  else {
    if (s->read_from_callbacks == 0) {
LAB_00111c0a:
      psVar17 = g->out;
      if (psVar17 == (stbi_uc *)0x0) {
        return (stbi_uc *)0x0;
      }
      if (psVar1 != (stbi_uc *)0x0) {
        return psVar17;
      }
      uVar9 = g->h * g->w;
      if ((int)uVar9 < 1 || g->bgindex < 1) {
        return psVar17;
      }
      uVar22 = 0;
      do {
        if (g->history[uVar22] == '\0') {
          g->pal[g->bgindex][3] = 0xff;
          *(stbi_uc (*) [4])(g->out + uVar22 * 4) = g->pal[g->bgindex];
        }
        uVar22 = uVar22 + 1;
      } while (uVar9 != uVar22);
      return psVar17;
    }
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar6 = 0;
      psVar16 = psVar15;
    }
    else {
      bVar6 = *psVar17;
      psVar16 = psVar17 + iVar8;
    }
    s->img_buffer_end = psVar16;
    s->img_buffer = psVar15;
  }
  if (bVar6 == 0) goto LAB_00111c0a;
  uVar24 = (uint)bVar6;
  goto LAB_00111b9a;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose; 
   int first_frame; 
   int pi; 
   int pcount; 

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0; 
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0))     return 0; // stbi__g_failure_reason set by stbi__gif_header
      g->out = (stbi_uc *) stbi__malloc(4 * g->w * g->h);
      g->background = (stbi_uc *) stbi__malloc(4 * g->w * g->h); 
      g->history = (stbi_uc *) stbi__malloc(g->w * g->h); 
      if (g->out == 0)                      return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "tranparent" at the start - ie, nothing overwrites the current background; 
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to teh color that was there the previous frame. 
      memset( g->out, 0x00, 4 * g->w * g->h ); 
      memset( g->background, 0x00, 4 * g->w * g->h ); // state of the background (starts transparent)
      memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame
      first_frame = 1; 
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2; 
      pcount = g->w * g->h; 

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 ); 
            }
         }
      } else if (dispose == 2) { 
         // restore what was changed last frame to background before that frame; 
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 ); 
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just 
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame; 
      memcpy( g->background, g->out, 4 * g->w * g->h ); 
   }

   // clear my history; 
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s); 
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");            
            
            o = stbi__process_gif_raster(s, g);
            if (o == NULL) return NULL;

            // if this was the first frame, 
            pcount = g->w * g->h; 
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be; 
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 ); 
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s); 
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255; 
                  } 
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0; 
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1); 
                     g->transparent = -1; 
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            } 
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}